

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::DoSimplePolygons(Clipper *this)

{
  OutPt *pOVar1;
  OutPt *pOVar2;
  bool bVar3;
  OutRec *pOVar4;
  reference ppOVar5;
  OutRec *pOVar6;
  OutRec *outrec2;
  OutPt *op4;
  OutPt *op3;
  OutPt *op2;
  OutPt *op;
  OutRec *outrec;
  size_type i;
  Clipper *this_local;
  
  outrec = (OutRec *)0x0;
  while (pOVar4 = (OutRec *)
                  std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                            ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                             ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3])),
        outrec < pOVar4) {
    pOVar6 = (OutRec *)((long)&outrec->Idx + 1);
    ppOVar5 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        ((vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_> *)
                         ((long)&this->m_ClipType + (long)this->_vptr_Clipper[-3]),(size_type)outrec
                        );
    pOVar4 = *ppOVar5;
    op2 = pOVar4->Pts;
    outrec = pOVar6;
    if ((op2 != (OutPt *)0x0) && ((pOVar4->IsOpen & 1U) == 0)) {
      do {
        for (op3 = op2->Next; op3 != pOVar4->Pts; op3 = op3->Next) {
          bVar3 = ClipperLib::operator==(&op2->Pt,&op3->Pt);
          if (((bVar3) && (op3->Next != op2)) && (op3->Prev != op2)) {
            pOVar1 = op2->Prev;
            pOVar2 = op3->Prev;
            op2->Prev = pOVar2;
            pOVar2->Next = op2;
            op3->Prev = pOVar1;
            pOVar1->Next = op3;
            pOVar4->Pts = op2;
            pOVar6 = ClipperBase::CreateOutRec
                               ((ClipperBase *)
                                ((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]));
            pOVar6->Pts = op3;
            UpdateOutPtIdxs(pOVar6);
            bVar3 = Poly2ContainsPoly1(pOVar6->Pts,pOVar4->Pts);
            if (bVar3) {
              pOVar6->IsHole = (bool)((pOVar4->IsHole ^ 0xffU) & 1);
              pOVar6->FirstLeft = pOVar4;
              if ((this->m_UsingPolyTree & 1U) != 0) {
                FixupFirstLefts2(this,pOVar6,pOVar4);
              }
            }
            else {
              bVar3 = Poly2ContainsPoly1(pOVar4->Pts,pOVar6->Pts);
              if (bVar3) {
                pOVar6->IsHole = (bool)(pOVar4->IsHole & 1);
                pOVar4->IsHole = (bool)((pOVar6->IsHole ^ 0xffU) & 1);
                pOVar6->FirstLeft = pOVar4->FirstLeft;
                pOVar4->FirstLeft = pOVar6;
                if ((this->m_UsingPolyTree & 1U) != 0) {
                  FixupFirstLefts2(this,pOVar4,pOVar6);
                }
              }
              else {
                pOVar6->IsHole = (bool)(pOVar4->IsHole & 1);
                pOVar6->FirstLeft = pOVar4->FirstLeft;
                if ((this->m_UsingPolyTree & 1U) != 0) {
                  FixupFirstLefts1(this,pOVar4,pOVar6);
                }
              }
            }
            op3 = op2;
          }
        }
        op2 = op2->Next;
      } while (op2 != pOVar4->Pts);
    }
  }
  return;
}

Assistant:

void Clipper::DoSimplePolygons()
{
  PolyOutList::size_type i = 0;
  while (i < m_PolyOuts.size()) 
  {
    OutRec* outrec = m_PolyOuts[i++];
    OutPt* op = outrec->Pts;
    if (!op || outrec->IsOpen) continue;
    do //for each Pt in Polygon until duplicate found do ...
    {
      OutPt* op2 = op->Next;
      while (op2 != outrec->Pts) 
      {
        if ((op->Pt == op2->Pt) && op2->Next != op && op2->Prev != op) 
        {
          //split the polygon into two ...
          OutPt* op3 = op->Prev;
          OutPt* op4 = op2->Prev;
          op->Prev = op4;
          op4->Next = op;
          op2->Prev = op3;
          op3->Next = op2;

          outrec->Pts = op;
          OutRec* outrec2 = CreateOutRec();
          outrec2->Pts = op2;
          UpdateOutPtIdxs(*outrec2);
          if (Poly2ContainsPoly1(outrec2->Pts, outrec->Pts))
          {
            //OutRec2 is contained by OutRec1 ...
            outrec2->IsHole = !outrec->IsHole;
            outrec2->FirstLeft = outrec;
            if (m_UsingPolyTree) FixupFirstLefts2(outrec2, outrec);
          }
          else
            if (Poly2ContainsPoly1(outrec->Pts, outrec2->Pts))
          {
            //OutRec1 is contained by OutRec2 ...
            outrec2->IsHole = outrec->IsHole;
            outrec->IsHole = !outrec2->IsHole;
            outrec2->FirstLeft = outrec->FirstLeft;
            outrec->FirstLeft = outrec2;
            if (m_UsingPolyTree) FixupFirstLefts2(outrec, outrec2);
            }
            else
          {
            //the 2 polygons are separate ...
            outrec2->IsHole = outrec->IsHole;
            outrec2->FirstLeft = outrec->FirstLeft;
            if (m_UsingPolyTree) FixupFirstLefts1(outrec, outrec2);
            }
          op2 = op; //ie get ready for the Next iteration
        }
        op2 = op2->Next;
      }
      op = op->Next;
    }
    while (op != outrec->Pts);
  }
}